

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O1

ssh2_mac * hmac_new(ssh2_macalg *alg,ssh_cipher *cipher)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  long *plVar4;
  void *pvVar5;
  strbuf *psVar6;
  char *pcVar7;
  
  plVar3 = (long *)safemalloc(1,0x40,0);
  puVar1 = (undefined8 *)alg->extra;
  plVar4 = (long *)(**(code **)*puVar1)();
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  plVar3[1] = (long)plVar4;
  puVar2 = (undefined8 *)*plVar4;
  *plVar3 = (long)puVar2;
  plVar4 = (long *)(*(code *)*puVar2)();
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  plVar3[2] = (long)plVar4;
  plVar4 = (long *)(**(code **)*plVar3)();
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  plVar3[3] = (long)plVar4;
  if (*(long *)(*plVar3 + 0x30) != 0) {
    pvVar5 = safemalloc(*(size_t *)(*plVar3 + 0x28),1,0);
    plVar3[4] = (long)pvVar5;
    psVar6 = strbuf_new();
    plVar3[5] = (long)psVar6;
    BinarySink_put_fmt(psVar6->binarysink_,"HMAC-%s%s",*(undefined8 *)(*plVar3 + 0x38),puVar1[1]);
    if ((puVar1[2] != 0) || (*(long *)(*plVar3 + 0x40) != 0)) {
      BinarySink_put_fmt((BinarySink *)(plVar3[5] + 0x18)," (");
      if (puVar1[2] == 0) {
        pcVar7 = "";
      }
      else {
        BinarySink_put_fmt((BinarySink *)(plVar3[5] + 0x18),"%s%s","");
        pcVar7 = ", ";
      }
      if (*(long *)(*plVar3 + 0x40) != 0) {
        BinarySink_put_fmt((BinarySink *)(plVar3[5] + 0x18),"%s%s",pcVar7);
      }
      BinarySink_put_fmt((BinarySink *)(plVar3[5] + 0x18),")");
    }
    plVar3[6] = (long)alg;
    plVar3[7] = *(long *)(plVar3[3] + 8);
    return (ssh2_mac *)(plVar3 + 6);
  }
  __assert_fail("ctx->hashalg->blocklen",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/hmac.c",
                0x28,"ssh2_mac *hmac_new(const ssh2_macalg *, ssh_cipher *)");
}

Assistant:

static ssh2_mac *hmac_new(const ssh2_macalg *alg, ssh_cipher *cipher)
{
    struct hmac *ctx = snew(struct hmac);
    const struct hmac_extra *extra = (const struct hmac_extra *)alg->extra;

    ctx->h_outer = ssh_hash_new(extra->hashalg_base);
    /* In case that hashalg was a selector vtable, we'll now switch to
     * using whatever real one it selected, for all future purposes. */
    ctx->hashalg = ssh_hash_alg(ctx->h_outer);
    ctx->h_inner = ssh_hash_new(ctx->hashalg);
    ctx->h_live = ssh_hash_new(ctx->hashalg);

    /*
     * HMAC is not well defined as a wrapper on an absolutely general
     * hash function; it expects that the function it's wrapping will
     * consume data in fixed-size blocks, and it's partially defined
     * in terms of that block size. So we insist that the hash we're
     * given must have defined a meaningful block size.
     */
    assert(ctx->hashalg->blocklen);

    ctx->digest = snewn(ctx->hashalg->hlen, uint8_t);

    ctx->text_name = strbuf_new();
    put_fmt(ctx->text_name, "HMAC-%s%s",
            ctx->hashalg->text_basename, extra->suffix);
    if (extra->annotation || ctx->hashalg->annotation) {
        put_fmt(ctx->text_name, " (");
        const char *sep = "";
        if (extra->annotation) {
            put_fmt(ctx->text_name, "%s%s", sep, extra->annotation);
            sep = ", ";
        }
        if (ctx->hashalg->annotation) {
            put_fmt(ctx->text_name, "%s%s", sep, ctx->hashalg->annotation);
            sep = ", ";
        }
        put_fmt(ctx->text_name, ")");
    }

    ctx->mac.vt = alg;
    BinarySink_DELEGATE_INIT(&ctx->mac, ctx->h_live);

    return &ctx->mac;
}